

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void VerifyHash(void *key,int len,uint32_t seed,void *out)

{
  int iVar1;
  int iVar2;
  uint32_t local_24;
  
  local_24 = seed;
  g_inputVCode = MurmurOAAT((char *)key,len,g_inputVCode);
  g_inputVCode = MurmurOAAT((char *)&local_24,4,g_inputVCode);
  (*g_hashUnderTest->hash)(key,len,local_24,out);
  iVar1 = g_hashUnderTest->hashbits;
  iVar2 = iVar1 + 7;
  if (-1 < iVar1) {
    iVar2 = iVar1;
  }
  g_outputVCode = MurmurOAAT((char *)out,iVar2 >> 3,g_outputVCode);
  return;
}

Assistant:

void VerifyHash ( const void * key, int len, uint32_t seed, void * out )
{
  g_inputVCode = MurmurOAAT((const char *)key, len, g_inputVCode);
  g_inputVCode = MurmurOAAT((const char *)&seed, sizeof(uint32_t), g_inputVCode);

  g_hashUnderTest->hash(key, len, seed, out);

  g_outputVCode = MurmurOAAT((const char *)out, g_hashUnderTest->hashbits/8, g_outputVCode);
}